

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  undefined4 uVar2;
  undefined8 in_RAX;
  wostream *pwVar3;
  undefined8 uStack_18;
  
  plVar1 = *(long **)(*(long *)(std::wcout + -0x18) + 0x105128);
  uStack_18 = in_RAX;
  if (plVar1 != (long *)0x0) {
    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
    uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       ((wostream *)&std::wcout,(wchar_t *)((long)&uStack_18 + 4),1);
    pwVar3 = std::operator<<(pwVar3,"#1) The preceeding new line was ");
    std::operator<<(pwVar3,"created with a UTF-8 Character Literal.");
    pwVar3 = std::operator<<((wostream *)&std::wcout,
                             "\n#2) A character from the 96 Characters of The ");
    pwVar3 = std::operator<<(pwVar3,"Basic Source Character Set: \"");
    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x25);
      uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
      plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x22);
        uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
        pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
        pwVar3 = std::operator<<(pwVar3,".");
        plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put((wchar_t)pwVar3);
          std::wostream::flush();
          pwVar3 = std::operator<<((wostream *)&std::wcout,"#3) Universal Character Names: ");
          pwVar3 = std::operator<<(pwVar3,"\t\"Is ");
          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
          if (plVar1 != (long *)0x0) {
            uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x28);
            uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
            pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                               (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
            plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
            if (plVar1 != (long *)0x0) {
              uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x38);
              uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
              pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                 (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
              plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
              if (plVar1 != (long *)0x0) {
                uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x5e);
                uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                   (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
                if (plVar1 != (long *)0x0) {
                  uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x39);
                  uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                  pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                     (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
                  if (plVar1 != (long *)0x0) {
                    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x29);
                    uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                       (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
                    if (plVar1 != (long *)0x0) {
                      uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x20);
                      uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                      pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                         (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                      plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
                      if (plVar1 != (long *)0x0) {
                        uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x3c);
                        uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                        pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                           (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                        plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
                        if (plVar1 != (long *)0x0) {
                          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x20);
                          uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                          pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                             (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
                          if (plVar1 != (long *)0x0) {
                            uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x38);
                            uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                            pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                               (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                            plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
                            if (plVar1 != (long *)0x0) {
                              uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x32);
                              uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                              pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                 (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                              plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0
                                                 );
                              if (plVar1 != (long *)0x0) {
                                uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x20);
                                uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                                pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                   (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                                plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) +
                                                             0xf0);
                                if (plVar1 != (long *)0x0) {
                                  uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x3f);
                                  uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                                  pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                     (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                                  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) +
                                                               0xf0);
                                  if (plVar1 != (long *)0x0) {
                                    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,0x22);
                                    uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                                    pwVar3 = std::
                                             __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                       (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                                    pwVar3 = std::operator<<(pwVar3,"\tNO.");
                                    plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18)
                                                                 + 0xf0);
                                    if (plVar1 != (long *)0x0) {
                                      (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                      std::wostream::put((wchar_t)pwVar3);
                                      std::wostream::flush();
                                      pwVar3 = std::operator<<((wostream *)&std::wcout,
                                                                                                                              
                                                  "\nCurious about Emoji\'s too?\nCheck out a few:  "
                                                  );
                                      plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18
                                                                            ) + 0xf0);
                                      if (plVar1 != (long *)0x0) {
                                        uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                        uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                                        pwVar3 = std::
                                                 __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                           (pwVar3,(wchar_t *)((long)&uStack_18 + 4)
                                                            ,1);
                                        plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 +
                                                                              -0x18) + 0xf0);
                                        if (plVar1 != (long *)0x0) {
                                          uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                          uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                                          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                    (pwVar3,(wchar_t *)((long)&uStack_18 + 4),1);
                                          pwVar3 = std::operator<<((wostream *)&std::wcout,
                                                                                                                                      
                                                  "Unicode 6.0--\t\t\"BANANA\"\t\t\t(U+1D11E): \t\t"
                                                  );
                                          uStack_18 = CONCAT44(0x1f34c,(undefined4)uStack_18);
                                          pwVar3 = std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                          plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 +
                                                                                -0x18) + 0xf0);
                                          if (plVar1 != (long *)0x0) {
                                            (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                            std::wostream::put((wchar_t)pwVar3);
                                            std::wostream::flush();
                                            pwVar3 = std::operator<<((wostream *)&std::wcout,
                                                                                                                                          
                                                  "Unicode 8.0--\t\t\"NERD FACE\"\t\t\t(U+1F913): \t\t"
                                                  );
                                            uStack_18 = CONCAT44(0x1f913,(undefined4)uStack_18);
                                            pwVar3 = std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                            plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 +
                                                                                  -0x18) + 0xf0);
                                            if (plVar1 != (long *)0x0) {
                                              (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                              std::wostream::put((wchar_t)pwVar3);
                                              std::wostream::flush();
                                              pwVar3 = std::operator<<((wostream *)&std::wcout,
                                                                                                                                              
                                                  "Unicode 8.0--\t\t\"UNICORN FACE\"\t\t\t(U+1F984): \t\t"
                                                  );
                                              uStack_18 = CONCAT44(0x1f984,(undefined4)uStack_18);
                                              pwVar3 = std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                              plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3
                                                                                    + -0x18) + 0xf0)
                                              ;
                                              if (plVar1 != (long *)0x0) {
                                                uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                                uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                                                std::
                                                __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                          (pwVar3,(wchar_t *)((long)&uStack_18 + 4),
                                                           1);
                                                pwVar3 = std::operator<<((wostream *)&std::wcout,
                                                                                                                                                  
                                                  "Unicode 8.0--\t\t\"UNICORN FACE\"\t\t\t(U+1F911): \t\t"
                                                  );
                                                uStack_18 = CONCAT44(0x1f911,(undefined4)uStack_18);
                                                pwVar3 = std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                                plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)
                                                  pwVar3 + -0x18) + 0xf0);
                                                if (plVar1 != (long *)0x0) {
                                                  uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                                  uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18);
                                                  std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                                  pwVar3 = std::operator<<((wostream *)&std::wcout,
                                                                                                                                                      
                                                  "Unicode 8.0--\t\t\"SIGN OF THE HORNS\"\t\t(U+1F918): \t\t"
                                                  );
                                                  uStack_18 = CONCAT44(0x1f918,(undefined4)uStack_18
                                                                      );
                                                  pwVar3 = std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                                  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)
                                                  pwVar3 + -0x18) + 0xf0);
                                                  if (plVar1 != (long *)0x0) {
                                                    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10)
                                                    ;
                                                    uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18
                                                                        );
                                                    std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                                  pwVar3 = std::operator<<((wostream *)&std::wcout,
                                                                                                                                                      
                                                  "Unicode 3.1--\t\t\"MUSICAL SYMBOL G CLEF\"\t\t(U+1D11E): \t\t"
                                                  );
                                                  uStack_18 = CONCAT44(0x1d11e,(undefined4)uStack_18
                                                                      );
                                                  pwVar3 = std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                                  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)
                                                  pwVar3 + -0x18) + 0xf0);
                                                  if (plVar1 != (long *)0x0) {
                                                    uVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10)
                                                    ;
                                                    uStack_18 = CONCAT44(uVar2,(undefined4)uStack_18
                                                                        );
                                                    pwVar3 = std::
                                                  __ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                                            (pwVar3,(wchar_t *)
                                                                    ((long)&uStack_18 + 4),1);
                                                  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)
                                                  pwVar3 + -0x18) + 0xf0);
                                                  if (plVar1 != (long *)0x0) {
                                                    (**(code **)(*plVar1 + 0x50))(plVar1,10);
                                                    std::wostream::put((wchar_t)pwVar3);
                                                    std::wostream::flush();
                                                    return 0;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__throw_bad_cast();
  halt_baddata();
}

Assistant:

int main() {
	/*You may need to the locale to UTF-8.
	Alternatively --> setLocale(LC_ALL, ""): */

	//Usage #1 -- Basic Escape Sequence
	std::wcout << u8'\n' << "#1) The preceeding new line was "
			<< "created with a UTF-8 Character Literal.";
	//Usage #2 -- Basic Source Character Set
	std::wcout << "\n#2) A character from the 96 Characters of The "
				<< "Basic Source Character Set: \"" << u8'%' << '\"'
				<< "." << std::endl;
	//Usage #3 -- Usage of Universal Character Name

	/*
		Universal Character Names
		Basic Latin or C0 Controls Unicode block
		U+0800 -> U+007F, 128 Codepoints
	*/
	char LEFTP = u8'\u0028';
	char RIGHTP = u8'\u0029';
	char BASE = u8'\u0038';
	char POWER = u8'\u005E';
	char EXP = u8'\u0039';
	char EQ = u8'\u003D';
	char AS = u8'\u002A';
	char TWO = u8'\u0032';
	char LT = u8'\u003C';
	char RES1 = u8'\u0038';
	char RES2 = u8'\u0032';
	char SPACE = u8'\u0020';
	char QUES = u8'\u003F';

	std::wcout << "#3) Universal Character Names: " << "\t\"Is " << LEFTP << BASE << POWER << EXP << RIGHTP
				<<SPACE << LT << SPACE << RES1 << RES2 << SPACE << QUES << '\"' << "\tNO." << std::endl;

	//Bonus: Unicode Emoji's
	std::wcout << "\nCurious about Emoji's too?\nCheck out a few:  " << u8'\n' << u8'\n';

	//Same Emojis
	wchar_t NERD_FACE = L'\U0001F913';
	wchar_t MONEY_MOUTH_FACE = L'\U0001F911';
	wchar_t SIGN_OF_THE_HORNS = L'\U0001F918';
	wchar_t UNICORN_FACE = L'\U0001F984';
	wchar_t MUSIC_GCLEF = L'\U0001D11E';
	wchar_t BANANA = L'\U0001F34C';

	//Let's print them.
	std::wcout<< "Unicode 6.0--\t\t\"BANANA\"\t\t\t(U+1D11E): \t\t" <<
				BANANA << std::endl;
	std::wcout<< "Unicode 8.0--\t\t\"NERD FACE\"\t\t\t(U+1F913): \t\t" <<
				NERD_FACE << std::endl;
	std::wcout<< "Unicode 8.0--\t\t\"UNICORN FACE\"\t\t\t(U+1F984): \t\t" <<
				UNICORN_FACE << '\n';
	std::wcout<< "Unicode 8.0--\t\t\"UNICORN FACE\"\t\t\t(U+1F911): \t\t" <<
				MONEY_MOUTH_FACE << '\n';
	std::wcout<< "Unicode 8.0--\t\t\"SIGN OF THE HORNS\"\t\t(U+1F918): \t\t" <<
				SIGN_OF_THE_HORNS << '\n';
	std::wcout<< "Unicode 3.1--\t\t\"MUSICAL SYMBOL G CLEF\"\t\t(U+1D11E): \t\t" <<
				MUSIC_GCLEF << '\n' << std::endl;
}